

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::AssertionStats::~AssertionStats(AssertionStats *this)

{
  this->_vptr_AssertionStats = (_func_int **)&PTR__AssertionStats_0018e500;
  clara::std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::~vector
            (&this->infoMessages);
  AssertionResult::~AssertionResult(&this->assertionResult);
  return;
}

Assistant:

AssertionStats::~AssertionStats() = default;